

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O2

int __thiscall
CNetBan::CBanPool<CNetRange,_16>::Remove(CBanPool<CNetRange,_16> *this,CBan<CNetRange> *pBan)

{
  CBan<CNetRange> *pCVar1;
  CBan<CNetRange> *pCVar2;
  CBan<CNetRange> **ppCVar3;
  
  if (pBan != (CBan<CNetRange> *)0x0) {
    pCVar1 = pBan->m_pHashNext;
    pCVar2 = pBan->m_pHashPrev;
    if (pCVar1 != (CBan<CNetRange> *)0x0) {
      pCVar1->m_pHashPrev = pCVar2;
    }
    if (pCVar2 == (CBan<CNetRange> *)0x0) {
      ppCVar3 = this->m_paaHashList[(pBan->m_NetHash).m_HashIndex] + (pBan->m_NetHash).m_Hash;
    }
    else {
      ppCVar3 = &pCVar2->m_pHashNext;
    }
    *ppCVar3 = pCVar1;
    pBan->m_pHashNext = (CBan<CNetRange> *)0x0;
    pBan->m_pHashPrev = (CBan<CNetRange> *)0x0;
    pCVar1 = pBan->m_pNext;
    pCVar2 = pBan->m_pPrev;
    if (pCVar1 != (CBan<CNetRange> *)0x0) {
      pCVar1->m_pPrev = pCVar2;
    }
    ppCVar3 = &pCVar2->m_pNext;
    if (pCVar2 == (CBan<CNetRange> *)0x0) {
      ppCVar3 = &this->m_pFirstUsed;
    }
    *ppCVar3 = pCVar1;
    pCVar1 = this->m_pFirstFree;
    if (pCVar1 != (CBan<CNetRange> *)0x0) {
      pCVar1->m_pPrev = pBan;
    }
    pBan->m_pPrev = (CBan<CNetRange> *)0x0;
    pBan->m_pNext = pCVar1;
    this->m_pFirstFree = pBan;
    this->m_CountUsed = this->m_CountUsed + -1;
    return 0;
  }
  return -1;
}

Assistant:

int CNetBan::CBanPool<T, HashCount>::Remove(CBan<T> *pBan)
{
	if(pBan == 0)
		return -1;

	// remove from hash list
	if(pBan->m_pHashNext)
		pBan->m_pHashNext->m_pHashPrev = pBan->m_pHashPrev;
	if(pBan->m_pHashPrev)
		pBan->m_pHashPrev->m_pHashNext = pBan->m_pHashNext;
	else
		m_paaHashList[pBan->m_NetHash.m_HashIndex][pBan->m_NetHash.m_Hash] = pBan->m_pHashNext;
	pBan->m_pHashNext = pBan->m_pHashPrev = 0;

	// remove from used list
	if(pBan->m_pNext)
		pBan->m_pNext->m_pPrev = pBan->m_pPrev;
	if(pBan->m_pPrev)
		pBan->m_pPrev->m_pNext = pBan->m_pNext;
	else
		m_pFirstUsed = pBan->m_pNext;

	// add to recycle list
	if(m_pFirstFree)
		m_pFirstFree->m_pPrev = pBan;
	pBan->m_pPrev = 0;
	pBan->m_pNext = m_pFirstFree;
	m_pFirstFree = pBan;

	// update ban count
	--m_CountUsed;

	return 0;
}